

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall TPZVec<TPZGeoNode_*>::TPZVec(TPZVec<TPZGeoNode_*> *this,TPZVec<TPZGeoNode_*> *rval)

{
  ulong uVar1;
  long lVar2;
  TPZGeoNode **ppTVar3;
  ulong uVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_018140f0;
  uVar1 = rval->fNElements;
  this->fNElements = uVar1;
  lVar2 = rval->fNAlloc;
  if (lVar2 == 0) {
    ppTVar3 = (TPZGeoNode **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = ppTVar3;
    if (0 < (long)uVar1) {
      uVar4 = 0;
      do {
        this->fStore[uVar4] = rval->fStore[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar2;
    rval->fStore = (TPZGeoNode **)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}